

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O3

void __thiscall
rsg::ConstructorOp::tokenize(ConstructorOp *this,GeneratorState *state,TokenStream *str)

{
  pointer ppEVar1;
  pointer pTVar2;
  size_t sVar3;
  size_t sVar4;
  __normal_iterator<rsg::Expression_*const_*,_std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>_>
  __tmp;
  pointer ppEVar5;
  Token local_38;
  
  VariableType::tokenizeShortType(&(this->m_valueRange).m_type,str);
  local_38.m_type = LEFT_PAREN;
  pTVar2 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar3 = (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pTVar2 >> 4;
  sVar4 = str->m_numTokens;
  if (sVar3 == sVar4) {
    std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar3 + 0x40);
    pTVar2 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar4 = str->m_numTokens;
  }
  Token::operator=(pTVar2 + sVar4,&local_38);
  str->m_numTokens = str->m_numTokens + 1;
  Token::~Token(&local_38);
  ppEVar5 = (this->m_inputExpressions).
            super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppEVar5 !=
      (this->m_inputExpressions).
      super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    do {
      if (ppEVar5 !=
          (this->m_inputExpressions).
          super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_38.m_type = COMMA;
        pTVar2 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl
                 .super__Vector_impl_data._M_start;
        sVar3 = (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 4;
        sVar4 = str->m_numTokens;
        if (sVar3 == sVar4) {
          std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar3 + 0x40);
          pTVar2 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          sVar4 = str->m_numTokens;
        }
        Token::operator=(pTVar2 + sVar4,&local_38);
        str->m_numTokens = str->m_numTokens + 1;
        Token::~Token(&local_38);
      }
      ppEVar1 = ppEVar5 + -1;
      ppEVar5 = ppEVar5 + -1;
      (*(*ppEVar1)->_vptr_Expression[3])(*ppEVar1,state,str);
    } while (ppEVar5 !=
             (this->m_inputExpressions).
             super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
             super__Vector_impl_data._M_start);
  }
  local_38.m_type = RIGHT_PAREN;
  pTVar2 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar3 = (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pTVar2 >> 4;
  sVar4 = str->m_numTokens;
  if (sVar3 == sVar4) {
    std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar3 + 0x40);
    pTVar2 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar4 = str->m_numTokens;
  }
  Token::operator=(pTVar2 + sVar4,&local_38);
  str->m_numTokens = str->m_numTokens + 1;
  Token::~Token(&local_38);
  return;
}

Assistant:

void ConstructorOp::tokenize (GeneratorState& state, TokenStream& str) const
{
	const VariableType& type = m_valueRange.getType();
	DE_ASSERT(type.getPrecision() == VariableType::PRECISION_NONE);
	type.tokenizeShortType(str);

	str << Token::LEFT_PAREN;

	for (vector<Expression*>::const_reverse_iterator i = m_inputExpressions.rbegin(); i != m_inputExpressions.rend(); i++)
	{
		if (i != m_inputExpressions.rbegin())
			str << Token::COMMA;
		(*i)->tokenize(state, str);
	}

	str << Token::RIGHT_PAREN;
}